

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarCloseTab(ImGuiTabBar *tab_bar,ImGuiTabItem *tab)

{
  ImGuiTabItem *tab_local;
  ImGuiTabBar *tab_bar_local;
  
  if ((tab_bar->VisibleTabId == tab->ID) && ((tab->Flags & 1U) == 0)) {
    tab->LastFrameVisible = -1;
    tab_bar->NextSelectedTabId = 0;
    tab_bar->SelectedTabId = 0;
  }
  else if ((tab_bar->VisibleTabId != tab->ID) && ((tab->Flags & 1U) != 0)) {
    tab_bar->NextSelectedTabId = tab->ID;
  }
  return;
}

Assistant:

void ImGui::TabBarCloseTab(ImGuiTabBar* tab_bar, ImGuiTabItem* tab)
{
    if ((tab_bar->VisibleTabId == tab->ID) && !(tab->Flags & ImGuiTabItemFlags_UnsavedDocument))
    {
        // This will remove a frame of lag for selecting another tab on closure.
        // However we don't run it in the case where the 'Unsaved' flag is set, so user gets a chance to fully undo the closure
        tab->LastFrameVisible = -1;
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId = 0;
    }
    else if ((tab_bar->VisibleTabId != tab->ID) && (tab->Flags & ImGuiTabItemFlags_UnsavedDocument))
    {
        // Actually select before expecting closure
        tab_bar->NextSelectedTabId = tab->ID;
    }
}